

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.cpp
# Opt level: O2

Action __thiscall
psy::C::NameCataloger::visitTranslationUnit(NameCataloger *this,TranslationUnitSyntax *node)

{
  DeclarationListSyntax *pDVar1;
  DeclarationListSyntax **ppDVar2;
  
  NameCatalog::indexNodeAndMarkAsEncloser
            ((this->catalog_)._M_t.
             super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>
             .super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl,
             &node->super_SyntaxNode);
  ppDVar2 = &node->decls_;
  while (pDVar1 = *ppDVar2, pDVar1 != (DeclarationListSyntax *)0x0) {
    SyntaxVisitor::visit
              (&this->super_SyntaxVisitor,
               &((pDVar1->
                 super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                 ).
                 super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                .value)->super_SyntaxNode);
    ppDVar2 = &(pDVar1->
               super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
               ).
               super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
               .next;
  }
  NameCatalog::dropEncloser
            ((this->catalog_)._M_t.
             super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>
             .super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl);
  return Skip;
}

Assistant:

SyntaxVisitor::Action NameCataloger::visitTranslationUnit(const TranslationUnitSyntax* node)
{
    catalog_->indexNodeAndMarkAsEncloser(node);
    for (auto iter = node->declarations(); iter; iter = iter->next)
        visit(iter->value);
    catalog_->dropEncloser();

#ifdef DBG_CATALOG
    std::cout << *catalog_ << std::endl;
#endif

    return Action::Skip;
}